

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

void lys_iffeature_free(ly_ctx *ctx,lys_iffeature *iffeature,uint8_t iffeature_size,int shallow,
                       _func_void_lys_node_ptr_void_ptr *private_destructor)

{
  undefined7 in_register_00000011;
  long lVar1;
  
  if ((int)CONCAT71(in_register_00000011,iffeature_size) != 0) {
    lVar1 = 0;
    do {
      lys_extension_instances_free
                (ctx,*(lys_ext_instance ***)((long)&iffeature->ext + lVar1),
                 (uint)(&iffeature->ext_size)[lVar1],private_destructor);
      if (shallow == 0) {
        free(*(void **)((long)&iffeature->expr + lVar1));
        free(*(void **)((long)&iffeature->features + lVar1));
      }
      lVar1 = lVar1 + 0x20;
    } while ((ulong)iffeature_size * 0x20 != lVar1);
  }
  free(iffeature);
  return;
}

Assistant:

API void
lys_iffeature_free(struct ly_ctx *ctx, struct lys_iffeature *iffeature, uint8_t iffeature_size,
                   int shallow, void (*private_destructor)(const struct lys_node *node, void *priv))
{
    uint8_t i;

    for (i = 0; i < iffeature_size; ++i) {
        lys_extension_instances_free(ctx, iffeature[i].ext, iffeature[i].ext_size, private_destructor);
        if (!shallow) {
            free(iffeature[i].expr);
            free(iffeature[i].features);
        }
    }
    free(iffeature);
}